

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp3::groebnerRow4_010_f
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar9 = (long)targetRow;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[lVar9];
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar11,auVar8);
  auVar12._0_8_ =
       auVar10._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x8b];
  auVar12._8_8_ = auVar10._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9] = 0.0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x9a];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[lVar9 + 0xf];
  auVar10 = vfmadd213sd_fma(auVar13,auVar12,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0xf] = auVar10._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xa9];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0x2d];
  auVar10 = vfmadd213sd_fma(auVar14,auVar12,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0x2d] = auVar10._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xb8];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0x3c];
  auVar10 = vfmadd213sd_fma(auVar15,auVar12,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0x3c] = auVar10._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[199];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0x5a];
  auVar10 = vfmadd213sd_fma(auVar16,auVar12,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0x5a] = auVar10._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xd6];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0x87];
  auVar10 = vfmadd213sd_fma(auVar17,auVar12,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0x87] = auVar10._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe5];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0x96];
  auVar10 = vfmadd213sd_fma(auVar18,auVar12,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0x96] = auVar10._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0xb4];
  auVar10 = vfmadd213sd_fma(auVar19,auVar12,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0xb4] = auVar10._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x103];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
                 m_storage.m_data.array[lVar9 + 0xe1];
  auVar10 = vfmadd213sd_fma(auVar20,auVar12,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[lVar9 + 0xe1] = auVar10._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::groebnerRow4_010_f( Eigen::Matrix<double,15,18> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,0) / groebnerMatrix(4,9);
  groebnerMatrix(targetRow,0) = 0.0;
  groebnerMatrix(targetRow,1) -= factor * groebnerMatrix(4,10);
  groebnerMatrix(targetRow,3) -= factor * groebnerMatrix(4,11);
  groebnerMatrix(targetRow,4) -= factor * groebnerMatrix(4,12);
  groebnerMatrix(targetRow,6) -= factor * groebnerMatrix(4,13);
  groebnerMatrix(targetRow,9) -= factor * groebnerMatrix(4,14);
  groebnerMatrix(targetRow,10) -= factor * groebnerMatrix(4,15);
  groebnerMatrix(targetRow,12) -= factor * groebnerMatrix(4,16);
  groebnerMatrix(targetRow,15) -= factor * groebnerMatrix(4,17);
}